

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O3

string * __thiscall
mg::string::format<char*,unsigned_int>
          (string *__return_storage_ptr__,string *this,string *format,char *args,uint args_1)

{
  int iVar1;
  char cVar2;
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  iVar1 = snprintf((char *)0x0,0,*(char **)this,format,(ulong)args & 0xffffffff);
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)(iVar1 + 1);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar2);
  snprintf((__return_storage_ptr__->_M_dataplus)._M_p,(long)(iVar1 + 1),*(char **)this,format,
           (ulong)args & 0xffffffff,in_R9,paVar3);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar2 + -1);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &format, Args... args) {
  size_t size = snprintf(nullptr, 0, format.c_str(), args...) + 1;
  std::string ret;
  ret.resize(size);
  snprintf(&ret[0], size, format.c_str(), args...);
  ret.resize(size - 1);
  return ret;
}